

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CCallExpression *expression)

{
  CExpressionList *pCVar1;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar2;
  int i;
  ulong uVar3;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  ChildrenAnswers answers;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_d8;
  ChildrenAnswers local_c0;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_90;
  string local_78;
  ChildrenAnswers local_58;
  
  local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (INode **)0x0;
  local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (INode **)0x0;
  local_c0.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CCallExpression::getFunction(expression);
  if (local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<IRT::INode_const*,std::allocator<IRT::INode_const*>>::
    _M_realloc_insert<IRT::INode_const*>
              ((vector<IRT::INode_const*,std::allocator<IRT::INode_const*>> *)&local_d8,
               (iterator)
               local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(INode **)&local_c0);
  }
  else {
    *local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
     super__Vector_impl_data._M_finish =
         (INode *)local_c0.descriptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  uVar3 = 0;
  while( true ) {
    pCVar1 = CCallExpression::getArguments(expression);
    pvVar2 = CExpressionList::getExpressions(pCVar1);
    if ((ulong)((long)(pvVar2->
                      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar2->
                      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
    pCVar1 = CCallExpression::getArguments(expression);
    pvVar2 = CExpressionList::getExpressions(pCVar1);
    local_c0.descriptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &(pvVar2->
           super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t;
    if (local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<IRT::INode_const*,std::allocator<IRT::INode_const*>>::
      _M_realloc_insert<IRT::INode_const*>
                ((vector<IRT::INode_const*,std::allocator<IRT::INode_const*>> *)&local_d8,
                 (iterator)
                 local_d8.
                 super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl
                 .super__Vector_impl_data._M_finish,(INode **)&local_c0);
    }
    else {
      *local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (INode *)local_c0.descriptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar3 = uVar3 + 1;
  }
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector(&local_90,&local_d8);
  VisitChildren(&local_c0,this,&local_90);
  if (local_90.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58.descriptions,&local_c0.descriptions);
  std::vector<int,_std::allocator<int>_>::vector(&local_58.ids,&local_c0.ids);
  AddChildrenAnswers(this,&local_58);
  if (local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.descriptions);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Call","");
  AddLabel(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_c0.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.descriptions);
  if (local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CCallExpression &expression ) {
    std::vector<const IRT::INode *> children;
    children.push_back( expression.getFunction( ));
    for ( int i = 0; i < expression.getArguments( )->getExpressions( ).size( ); ++i ) {
        children.push_back( expression.getArguments( )->getExpressions( )[ i ].get( ));
    }
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "Call" );
    ++lastVisited;
}